

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppLog(bool *p_open)

{
  char *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  char *word;
  char *category;
  int n;
  char *words [7];
  char *categories [3];
  ImVec2 local_24 [2];
  bool *local_10;
  bool *p_open_local;
  
  local_10 = p_open;
  if ((ShowExampleAppLog(bool*)::log == '\0') &&
     (iVar4 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar4 != 0)) {
    ExampleAppLog::ExampleAppLog(&ShowExampleAppLog::log);
    __cxa_atexit(ExampleAppLog::~ExampleAppLog,&ShowExampleAppLog::log,&__dso_handle);
    __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
  }
  ImVec2::ImVec2(local_24,500.0,400.0);
  ImGui::SetNextWindowSize(local_24,4);
  ImGui::Begin("Example: Log",local_10,0);
  bVar3 = ImGui::SmallButton("[Debug] Add 5 entries");
  if (bVar3) {
    categories[0] = "warn";
    categories[1] = "error";
    memcpy(&stack0xffffffffffffff78,&PTR_anon_var_dwarf_294080_00570960,0x38);
    for (category._4_4_ = 0; category._4_4_ < 5; category._4_4_ = category._4_4_ + 1) {
      pcVar1 = categories[(long)(ShowExampleAppLog::counter % 3) + -1];
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff78 + (long)(ShowExampleAppLog::counter % 7) * 8)
      ;
      uVar5 = ImGui::GetFrameCount();
      ImGui::GetTime();
      ExampleAppLog::AddLog
                (&ShowExampleAppLog::log,
                 "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",(ulong)uVar5,
                 pcVar1,uVar2);
      ShowExampleAppLog::counter = ShowExampleAppLog::counter + 1;
    }
  }
  ImGui::End();
  ExampleAppLog::Draw(&ShowExampleAppLog::log,"Example: Log",local_10);
  return;
}

Assistant:

static void ShowExampleAppLog(bool* p_open)
{
    static ExampleAppLog log;

    // For the demo: add a debug button _BEFORE_ the normal log window contents
    // We take advantage of a rarely used feature: multiple calls to Begin()/End() are appending to the _same_ window.
    // Most of the contents of the window will be added by the log.Draw() call.
    ImGui::SetNextWindowSize(ImVec2(500, 400), ImGuiCond_FirstUseEver);
    ImGui::Begin("Example: Log", p_open);
    if (ImGui::SmallButton("[Debug] Add 5 entries"))
    {
        static int counter = 0;
        const char* categories[3] = { "info", "warn", "error" };
        const char* words[] = { "Bumfuzzled", "Cattywampus", "Snickersnee", "Abibliophobia", "Absquatulate", "Nincompoop", "Pauciloquent" };
        for (int n = 0; n < 5; n++)
        {
            const char* category = categories[counter % IM_ARRAYSIZE(categories)];
            const char* word = words[counter % IM_ARRAYSIZE(words)];
            log.AddLog("[%05d] [%s] Hello, current time is %.1f, here's a word: '%s'\n",
                ImGui::GetFrameCount(), category, ImGui::GetTime(), word);
            counter++;
        }
    }
    ImGui::End();

    // Actually call in the regular Log helper (which will Begin() into the same window as we just did)
    log.Draw("Example: Log", p_open);
}